

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O0

Point3<float>
pbrt::BlossomCubicBezier<pbrt::Point3<float>>
          (span<const_pbrt::Point3<float>_> p,Float u0,Float u1,Float u2)

{
  undefined8 uVar1;
  Tuple3<pbrt::Point3,_float> TVar2;
  undefined1 auVar9 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Point3<float> PVar10;
  Point3<float> b [2];
  Point3<float> a [3];
  Tuple3<pbrt::Point3,_float> *in_stack_ffffffffffffff10;
  Tuple3<pbrt::Point3,_float> *t1;
  Tuple3<pbrt::Point3,_float> *in_stack_ffffffffffffff18;
  Float in_stack_ffffffffffffff24;
  Tuple3<pbrt::Point3,_float> local_9c;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_4c;
  float local_44;
  undefined8 local_40;
  float local_38;
  span<const_pbrt::Point3<float>_> local_20 [2];
  
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,0);
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,1);
  auVar9 = (undefined1  [56])0x0;
  PVar10 = Lerp<pbrt::Point3,float>
                     (in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
  ;
  local_60 = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar9;
  local_68 = vmovlpd_avx(auVar3._0_16_);
  local_58 = local_68;
  local_50 = local_60;
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,1);
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,2);
  auVar9 = (undefined1  [56])0x0;
  PVar10 = Lerp<pbrt::Point3,float>
                     (in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
  ;
  local_70 = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar9;
  local_78 = vmovlpd_avx(auVar4._0_16_);
  local_4c = local_78;
  local_44 = local_70;
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,2);
  pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,3);
  auVar9 = (undefined1  [56])0x0;
  PVar10 = Lerp<pbrt::Point3,float>
                     (in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
  ;
  local_80 = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar9;
  local_88 = vmovlpd_avx(auVar5._0_16_);
  auVar9 = (undefined1  [56])0x0;
  local_40 = local_88;
  local_38 = local_80;
  PVar10 = Lerp<pbrt::Point3,float>
                     (in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
  ;
  auVar6._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar9;
  vmovlpd_avx(auVar6._0_16_);
  t1 = &local_9c;
  auVar9 = (undefined1  [56])0x0;
  PVar10 = Lerp<pbrt::Point3,float>(in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,t1);
  local_9c.z = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_9c._0_8_ = vmovlpd_avx(auVar7._0_16_);
  auVar9 = (undefined1  [56])0x0;
  PVar10 = Lerp<pbrt::Point3,float>(in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,t1);
  auVar8._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  TVar2.z = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  TVar2.x = (float)(int)uVar1;
  TVar2.y = (float)(int)((ulong)uVar1 >> 0x20);
  return (Point3<float>)TVar2;
}

Assistant:

PBRT_CPU_GPU inline P BlossomCubicBezier(pstd::span<const P> p, Float u0, Float u1,
                                         Float u2) {
    P a[3] = {Lerp(u0, p[0], p[1]), Lerp(u0, p[1], p[2]), Lerp(u0, p[2], p[3])};
    P b[2] = {Lerp(u1, a[0], a[1]), Lerp(u1, a[1], a[2])};
    return Lerp(u2, b[0], b[1]);
}